

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

int run_test(pcut_item_t *test)

{
  pcut_item_t **pppVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = _setjmp((__jmp_buf_tag *)start_test_jump);
  iVar3 = 1;
  if (iVar2 == 0) {
    if (report_test_result == '\x01') {
      pcut_report_test_start(test);
    }
    current_suite = test;
    if (test != (pcut_item_t *)0x0) {
      do {
        if (current_suite->kind == 4) goto LAB_001033bf;
        pppVar1 = &current_suite->previous;
        current_suite = *pppVar1;
      } while (*pppVar1 != (pcut_item_t *)0x0);
    }
    default_suite.id = -1;
    default_suite.kind = 4;
    current_suite = &default_suite;
    default_suite.previous = (pcut_item_t *)0x0;
    default_suite.next = (pcut_item_t *)0x0;
    default_suite.name = "Default";
    default_suite.setup_func = (pcut_setup_func_t)0x0;
    default_suite.teardown_func = (pcut_setup_func_t)0x0;
LAB_001033bf:
    current_test = test;
    pcut_hook_before_test(test);
    execute_teardown_on_failure = 1;
    if (current_suite->setup_func != (pcut_setup_func_t)0x0) {
      (*current_suite->setup_func)();
    }
    (*test->test_func)();
    execute_teardown_on_failure = 0;
    if (current_suite->teardown_func != (pcut_setup_func_t)0x0) {
      (*current_suite->teardown_func)();
    }
    iVar3 = 0;
    if (report_test_result == '\x01') {
      iVar3 = 0;
      pcut_report_test_done(current_test,0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  return iVar3;
}

Assistant:

static int run_test(pcut_item_t *test) {
	/*
	 * Set here as the returning point in case of test failure.
	 * If we get here, it means something failed during the
	 * test execution.
	 */
#ifndef PCUT_NO_LONG_JUMP
	int test_finished = setjmp(start_test_jump);
	if (test_finished) {
		return PCUT_OUTCOME_FAIL;
	}
#endif

	if (report_test_result) {
		pcut_report_test_start(test);
	}

	current_suite = pcut_find_parent_suite(test);
	current_test = test;

	pcut_hook_before_test(test);

	/*
	 * If anything goes wrong, execute the tear-down function
	 * as well.
	 */
	execute_teardown_on_failure = 1;

	/*
	 * Run the set-up function.
	 */
	run_setup_teardown(current_suite->setup_func);

	/*
	 * The setup function was performed, it is time to run
	 * the actual test.
	 */
	test->test_func();

	/*
	 * Finally, run the tear-down function. We need to clear
	 * the flag to prevent endless loop.
	 */
	execute_teardown_on_failure = 0;
	run_setup_teardown(current_suite->teardown_func);

	/*
	 * If we got here, it means everything went well with
	 * this test.
	 */
	if (report_test_result) {
		pcut_report_test_done(current_test, PCUT_OUTCOME_PASS,
			NULL, NULL, NULL);
	}

	return PCUT_OUTCOME_PASS;
}